

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O3

int feederBig2(void)

{
  uint uVar1;
  DWORD DVar2;
  uint uVar3;
  int iVar4;
  DWORD DVar5;
  uint uVar6;
  FILE *__stream;
  uint uVar7;
  uint uVar8;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
LAB_00103b39:
    iVar4 = -1;
  }
  else {
    printf("Creating a large graph...");
    fflush(_stdout);
    DVar2 = GetTickCount();
    fprintf(__stream,"5000\n1 2\n%d\n",0xbeb25b);
    uVar7 = 2;
    uVar6 = 0;
    uVar8 = uVar7;
    uVar3 = 1;
    do {
      do {
        if ((((1 < uVar6) && (uVar6 != 0x7c0)) || ((uVar7 != 2 && (uVar7 != 0x7c1)))) &&
           (iVar4 = fprintf(__stream,"%d %d 2\n",(ulong)uVar3,(ulong)uVar7), iVar4 < 2)) {
          puts("can\'t create in.txt. No space on disk?");
          fclose(__stream);
          goto LAB_00103b39;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x1389);
      uVar1 = uVar3 + 1;
      uVar7 = uVar8 + 1;
      uVar6 = uVar3;
      uVar8 = uVar7;
      uVar3 = uVar1;
    } while (uVar1 != 5000);
    fwrite("1 1985 1\n",9,1,__stream);
    fwrite("2 1985 1\n",9,1,__stream);
    fclose(__stream);
    DVar5 = GetTickCount();
    uVar6 = RoundUptoThousand(DVar5 - DVar2);
    iVar4 = 0;
    printf("done in T=%u seconds. Starting exe with timeout T+6... ",(ulong)uVar6 / 1000);
    LabTimeout = uVar6 + 6000;
    fflush(_stdout);
    LabMemoryLimit = 1;
  }
  return iVar4;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating a large graph...");
    fflush(stdout);
    t = GetTickCount();

    fprintf(in, "5000\n1 2\n%d\n", 5000*4999/2-1);
    for (i = 0; i+1 < 5000; i++) {
        int j;
        for (j = i+1; j < 5000; j++) {
            if ((i == 0 || i == 1 || i == 1984) && (j == 0 || j == 1 || j == 1984)) {
                continue;
            }
            if (fprintf(in, "%d %d 2\n", i+1, j+1) < 2) {
                printf("can't create in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }
    }
    fprintf(in, "1 1985 1\n");
    fprintf(in, "2 1985 1\n");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout T+6... ", (unsigned)t/1000);
    LabTimeout = (int)t+6000;
    fflush(stdout);
    LabMemoryLimit = 5000*5000*4+MIN_PROCESS_RSS_BYTES;
    return 0;
}